

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O0

bool __thiscall
ON_PolyCurve::Split(ON_PolyCurve *this,double split_parameter,ON_Curve **left_side,
                   ON_Curve **right_side)

{
  ON_Curve *pOVar1;
  ON_Curve *pOVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  double *pdVar6;
  ulong uVar7;
  ON_Curve **ppOVar8;
  double dVar9;
  bool local_159;
  ON_PolyCurve *this_ptr;
  ON_Curve *local_140;
  undefined4 local_134;
  ON_Curve *local_130;
  ON_Curve *local_128 [3];
  int local_10c;
  undefined1 local_108 [4];
  int i;
  ON_SimpleArray<double> right_t;
  ON_SimpleArray<double> left_t;
  ON_SimpleArray<ON_Curve_*> right_segment;
  ON_SimpleArray<ON_Curve_*> left_segment;
  double fuzz;
  ON_Curve *seg_right;
  ON_Curve *seg_left;
  double c;
  ON_Interval c_dom;
  ON_Curve *seg_curve;
  ON_Interval s_dom;
  bool split_at_break;
  ON_PolyCurve *pOStack_58;
  bool bDupSegs;
  ON_PolyCurve *pRightSide;
  ON_PolyCurve *pLeftSide;
  ON_Interval dom;
  int si;
  ON_Curve **right_side_local;
  ON_Curve **left_side_local;
  double split_parameter_local;
  ON_PolyCurve *this_local;
  
  left_side_local = (ON_Curve **)split_parameter;
  split_parameter_local = (double)this;
  (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])();
  pRightSide = Cast((ON_Object *)*left_side);
  pOStack_58 = Cast((ON_Object *)*right_side);
  if ((pRightSide == (ON_PolyCurve *)0x0) || (pRightSide == this)) {
    if (pRightSide == this) {
      ON_Curve::DestroyCurveTree(&pRightSide->super_ON_Curve);
    }
  }
  else {
    Destroy(pRightSide);
  }
  if ((pOStack_58 == (ON_PolyCurve *)0x0) || (pOStack_58 == this)) {
    if (pOStack_58 == this) {
      ON_Curve::DestroyCurveTree(&pOStack_58->super_ON_Curve);
    }
  }
  else {
    Destroy(pOStack_58);
  }
  if ((*left_side != (ON_Curve *)0x0) && (pRightSide == (ON_PolyCurve *)0x0)) {
    this_local._7_1_ = 0;
    goto LAB_0080365b;
  }
  if ((*right_side != (ON_Curve *)0x0) && (pOStack_58 == (ON_PolyCurve *)0x0)) {
    this_local._7_1_ = 0;
    goto LAB_0080365b;
  }
  bVar3 = ON_Interval::Includes((ON_Interval *)&pLeftSide,(double)left_side_local,true);
  if (!bVar3) {
    this_local._7_1_ = 0;
    goto LAB_0080365b;
  }
  local_159 = this != pRightSide && this != pOStack_58;
  s_dom.m_t[1]._7_1_ = local_159;
  s_dom.m_t[1]._6_1_ =
       ParameterSearch(this,(double)left_side_local,(int *)((long)dom.m_t + 0xc),true);
  iVar5 = dom.m_t[1]._4_4_;
  if (((bool)s_dom.m_t[1]._6_1_) &&
     ((dom.m_t[1]._4_4_ < 1 || (iVar4 = Count(this), iVar4 <= iVar5)))) {
    this_local._7_1_ = 0;
    goto LAB_0080365b;
  }
  _seg_curve = SegmentDomain(this,dom.m_t[1]._4_4_);
  dVar9 = seg_curve._8_8_;
  c_dom.m_t[1] = (double)SegmentCurve(this,dom.m_t[1]._4_4_);
  if ((ON_Curve *)c_dom.m_t[1] == (ON_Curve *)0x0) {
    this_local._7_1_ = 0;
    goto LAB_0080365b;
  }
  (*(((ON_Curve *)c_dom.m_t[1])->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])();
  c_dom.m_t[0] = dVar9;
  if ((s_dom.m_t[1]._6_1_ & 1) == 0) {
    seg_left = (ON_Curve *)
               ON_Interval::TransformParameterTo
                         ((ON_Interval *)&seg_curve,(ON_Interval *)&c,(double)left_side_local);
  }
  else {
    pdVar6 = ON_Interval::operator[]((ON_Interval *)&c,0);
    seg_left = (ON_Curve *)*pdVar6;
  }
  seg_right = (ON_Curve *)0x0;
  fuzz = 0.0;
  if (((s_dom.m_t[1]._6_1_ & 1) == 0) &&
     (bVar3 = ON_Interval::Includes((ON_Interval *)&c,(double)seg_left,true), bVar3)) {
    uVar7 = (**(code **)(*(long *)c_dom.m_t[1] + 0x1f0))(seg_left,c_dom.m_t[1],&seg_right,&fuzz);
    if ((uVar7 & 1) == 0) {
      dVar9 = ON_Interval::NormalizedParameterAt((ON_Interval *)&c,(double)seg_left);
      if (0.001 < dVar9) {
        dVar9 = ON_Interval::NormalizedParameterAt((ON_Interval *)&c,(double)seg_left);
        if (dVar9 < 0.999) {
          this_local._7_1_ = 0;
          goto LAB_0080365b;
        }
        pdVar6 = ON_Interval::operator[]((ON_Interval *)&c,1);
        seg_left = (ON_Curve *)*pdVar6;
      }
      else {
        pdVar6 = ON_Interval::operator[]((ON_Interval *)&c,0);
        seg_left = (ON_Curve *)*pdVar6;
      }
    }
  }
  else {
    pOVar1 = seg_left;
    dVar9 = ON_Interval::ParameterAt((ON_Interval *)&c,0.5);
    if (dVar9 < (double)pOVar1) {
      pdVar6 = ON_Interval::operator[]((ON_Interval *)&c,1);
      seg_left = (ON_Curve *)*pdVar6;
    }
    else {
      pdVar6 = ON_Interval::operator[]((ON_Interval *)&c,0);
      seg_left = (ON_Curve *)*pdVar6;
    }
  }
  ON_SimpleArray<ON_Curve_*>::ON_SimpleArray((ON_SimpleArray<ON_Curve_*> *)&right_segment.m_count);
  ON_SimpleArray<ON_Curve_*>::ON_SimpleArray((ON_SimpleArray<ON_Curve_*> *)&left_t.m_count);
  ON_SimpleArray<double>::ON_SimpleArray((ON_SimpleArray<double> *)&right_t.m_count);
  ON_SimpleArray<double>::ON_SimpleArray((ON_SimpleArray<double> *)local_108);
  pOVar1 = seg_left;
  if ((seg_right == (ON_Curve *)0x0) || (fuzz == 0.0)) {
    pdVar6 = ON_Interval::operator[]((ON_Interval *)&c,1);
    pOVar2 = seg_left;
    if (((double)pOVar1 == *pdVar6) && (!NAN((double)pOVar1) && !NAN(*pdVar6))) {
      dom.m_t[1]._4_4_ = dom.m_t[1]._4_4_ + 1;
    }
    pdVar6 = ON_Interval::operator[]((ON_Interval *)&c,0);
    pOVar1 = seg_left;
    if ((((double)pOVar2 != *pdVar6) || (NAN((double)pOVar2) || NAN(*pdVar6))) ||
       (dom.m_t[1]._4_4_ != 0)) {
      pdVar6 = ON_Interval::operator[]((ON_Interval *)&c,1);
      iVar5 = dom.m_t[1]._4_4_;
      if ((((double)pOVar1 != *pdVar6) || (NAN((double)pOVar1) || NAN(*pdVar6))) ||
         (iVar4 = ON_SimpleArray<ON_Curve_*>::Count
                            (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>), iVar5 != iVar4))
      {
        ON_SimpleArray<ON_Curve_*>::Reserve
                  ((ON_SimpleArray<ON_Curve_*> *)&right_segment.m_count,(long)dom.m_t[1]._4_4_);
        iVar5 = ON_SimpleArray<ON_Curve_*>::Count
                          (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>);
        ON_SimpleArray<ON_Curve_*>::Reserve
                  ((ON_SimpleArray<ON_Curve_*> *)&left_t.m_count,(long)(iVar5 - dom.m_t[1]._4_4_));
        iVar5 = ON_SimpleArray<ON_Curve_*>::Count
                          ((ON_SimpleArray<ON_Curve_*> *)&right_segment.m_count);
        ON_SimpleArray<double>::Reserve
                  ((ON_SimpleArray<double> *)&right_t.m_count,(long)(iVar5 + 1));
        iVar5 = ON_SimpleArray<ON_Curve_*>::Count((ON_SimpleArray<ON_Curve_*> *)&left_t.m_count);
        ON_SimpleArray<double>::Reserve((ON_SimpleArray<double> *)local_108,(long)(iVar5 + 1));
        for (local_10c = 0; local_10c < dom.m_t[1]._4_4_; local_10c = local_10c + 1) {
          if ((s_dom.m_t[1]._7_1_ & 1) == 0) {
            ppOVar8 = ON_SimpleArray<ON_Curve_*>::operator[]
                                (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,local_10c);
            ON_SimpleArray<ON_Curve_*>::Append
                      ((ON_SimpleArray<ON_Curve_*> *)&right_segment.m_count,ppOVar8);
          }
          else {
            ppOVar8 = ON_SimpleArray<ON_Curve_*>::operator[]
                                (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,local_10c);
            local_140 = ON_Curve::Duplicate(*ppOVar8);
            ON_SimpleArray<ON_Curve_*>::Append
                      ((ON_SimpleArray<ON_Curve_*> *)&right_segment.m_count,&local_140);
          }
          pdVar6 = ON_SimpleArray<double>::operator[](&this->m_t,local_10c);
          ON_SimpleArray<double>::Append((ON_SimpleArray<double> *)&right_t.m_count,pdVar6);
        }
        ON_SimpleArray<double>::Append
                  ((ON_SimpleArray<double> *)&right_t.m_count,(double *)&left_side_local);
        for (local_10c = dom.m_t[1]._4_4_; iVar5 = local_10c,
            iVar4 = ON_SimpleArray<ON_Curve_*>::Count
                              (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>), iVar5 < iVar4;
            local_10c = local_10c + 1) {
          if ((s_dom.m_t[1]._7_1_ & 1) == 0) {
            ppOVar8 = ON_SimpleArray<ON_Curve_*>::operator[]
                                (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,local_10c);
            ON_SimpleArray<ON_Curve_*>::Append
                      ((ON_SimpleArray<ON_Curve_*> *)&left_t.m_count,ppOVar8);
          }
          else {
            ppOVar8 = ON_SimpleArray<ON_Curve_*>::operator[]
                                (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,local_10c);
            this_ptr = (ON_PolyCurve *)ON_Curve::Duplicate(*ppOVar8);
            ON_SimpleArray<ON_Curve_*>::Append
                      ((ON_SimpleArray<ON_Curve_*> *)&left_t.m_count,(ON_Curve **)&this_ptr);
          }
          if (local_10c == dom.m_t[1]._4_4_) {
            ON_SimpleArray<double>::Append
                      ((ON_SimpleArray<double> *)local_108,(double *)&left_side_local);
          }
          else {
            pdVar6 = ON_SimpleArray<double>::operator[](&this->m_t,local_10c);
            ON_SimpleArray<double>::Append((ON_SimpleArray<double> *)local_108,pdVar6);
          }
        }
        iVar5 = ON_SimpleArray<ON_Curve_*>::Count
                          (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>);
        pdVar6 = ON_SimpleArray<double>::operator[](&this->m_t,iVar5);
        ON_SimpleArray<double>::Append((ON_SimpleArray<double> *)local_108,pdVar6);
        goto LAB_008033f7;
      }
    }
    this_local._7_1_ = 0;
  }
  else {
    ON_SimpleArray<ON_Curve_*>::Reserve
              ((ON_SimpleArray<ON_Curve_*> *)&right_segment.m_count,(long)(dom.m_t[1]._4_4_ + 1));
    iVar5 = ON_SimpleArray<ON_Curve_*>::Count(&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>);
    ON_SimpleArray<ON_Curve_*>::Reserve
              ((ON_SimpleArray<ON_Curve_*> *)&left_t.m_count,(long)(iVar5 - dom.m_t[1]._4_4_));
    iVar5 = ON_SimpleArray<ON_Curve_*>::Count((ON_SimpleArray<ON_Curve_*> *)&right_segment.m_count);
    ON_SimpleArray<double>::Reserve((ON_SimpleArray<double> *)&right_t.m_count,(long)(iVar5 + 1));
    iVar5 = ON_SimpleArray<ON_Curve_*>::Count((ON_SimpleArray<ON_Curve_*> *)&left_t.m_count);
    ON_SimpleArray<double>::Reserve((ON_SimpleArray<double> *)local_108,(long)(iVar5 + 1));
    if ((s_dom.m_t[1]._7_1_ & 1) == 0) {
      ppOVar8 = ON_SimpleArray<ON_Curve_*>::operator[]
                          (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,dom.m_t[1]._4_4_);
      if (*ppOVar8 != (ON_Curve *)0x0) {
        (*((*ppOVar8)->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
      }
      ppOVar8 = ON_SimpleArray<ON_Curve_*>::operator[]
                          (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,dom.m_t[1]._4_4_);
      *ppOVar8 = (ON_Curve *)0x0;
    }
    for (local_10c = 0; local_10c < dom.m_t[1]._4_4_; local_10c = local_10c + 1) {
      if ((s_dom.m_t[1]._7_1_ & 1) == 0) {
        ppOVar8 = ON_SimpleArray<ON_Curve_*>::operator[]
                            (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,local_10c);
        ON_SimpleArray<ON_Curve_*>::Append
                  ((ON_SimpleArray<ON_Curve_*> *)&right_segment.m_count,ppOVar8);
      }
      else {
        ppOVar8 = ON_SimpleArray<ON_Curve_*>::operator[]
                            (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,local_10c);
        local_128[0] = ON_Curve::Duplicate(*ppOVar8);
        ON_SimpleArray<ON_Curve_*>::Append
                  ((ON_SimpleArray<ON_Curve_*> *)&right_segment.m_count,local_128);
      }
      pdVar6 = ON_SimpleArray<double>::operator[](&this->m_t,local_10c);
      ON_SimpleArray<double>::Append((ON_SimpleArray<double> *)&right_t.m_count,pdVar6);
    }
    ON_SimpleArray<ON_Curve_*>::Append
              ((ON_SimpleArray<ON_Curve_*> *)&right_segment.m_count,&seg_right);
    pdVar6 = ON_SimpleArray<double>::operator[](&this->m_t,dom.m_t[1]._4_4_);
    ON_SimpleArray<double>::Append((ON_SimpleArray<double> *)&right_t.m_count,pdVar6);
    ON_SimpleArray<double>::Append
              ((ON_SimpleArray<double> *)&right_t.m_count,(double *)&left_side_local);
    ON_SimpleArray<ON_Curve_*>::Append
              ((ON_SimpleArray<ON_Curve_*> *)&left_t.m_count,(ON_Curve **)&fuzz);
    ON_SimpleArray<double>::Append((ON_SimpleArray<double> *)local_108,(double *)&left_side_local);
    local_10c = dom.m_t[1]._4_4_;
    while( true ) {
      local_10c = local_10c + 1;
      iVar5 = local_10c;
      iVar4 = ON_SimpleArray<ON_Curve_*>::Count(&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>)
      ;
      if (iVar4 <= iVar5) break;
      if ((s_dom.m_t[1]._7_1_ & 1) == 0) {
        ppOVar8 = ON_SimpleArray<ON_Curve_*>::operator[]
                            (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,local_10c);
        ON_SimpleArray<ON_Curve_*>::Append((ON_SimpleArray<ON_Curve_*> *)&left_t.m_count,ppOVar8);
      }
      else {
        ppOVar8 = ON_SimpleArray<ON_Curve_*>::operator[]
                            (&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,local_10c);
        local_130 = ON_Curve::Duplicate(*ppOVar8);
        ON_SimpleArray<ON_Curve_*>::Append((ON_SimpleArray<ON_Curve_*> *)&left_t.m_count,&local_130)
        ;
      }
      pdVar6 = ON_SimpleArray<double>::operator[](&this->m_t,local_10c);
      ON_SimpleArray<double>::Append((ON_SimpleArray<double> *)local_108,pdVar6);
    }
    iVar5 = ON_SimpleArray<ON_Curve_*>::Count(&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>);
    pdVar6 = ON_SimpleArray<double>::operator[](&this->m_t,iVar5);
    ON_SimpleArray<double>::Append((ON_SimpleArray<double> *)local_108,pdVar6);
LAB_008033f7:
    if (pRightSide == (ON_PolyCurve *)0x0) {
      pRightSide = (ON_PolyCurve *)operator_new(0x40);
      ON_PolyCurve(pRightSide);
    }
    if (pOStack_58 == (ON_PolyCurve *)0x0) {
      pOStack_58 = (ON_PolyCurve *)operator_new(0x40);
      ON_PolyCurve(pOStack_58);
    }
    if ((s_dom.m_t[1]._7_1_ & 1) == 0) {
      ON_SimpleArray<ON_Curve_*>::Zero(&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>);
      ON_SimpleArray<double>::Zero(&this->m_t);
      ON_SimpleArray<ON_Curve_*>::SetCount(&(this->m_segment).super_ON_SimpleArray<ON_Curve_*>,0);
      ON_SimpleArray<double>::SetCount(&this->m_t,0);
    }
    iVar5 = ON_SimpleArray<ON_Curve_*>::Count((ON_SimpleArray<ON_Curve_*> *)&right_segment.m_count);
    ppOVar8 = ON_SimpleArray<ON_Curve_*>::Array
                        ((ON_SimpleArray<ON_Curve_*> *)&right_segment.m_count);
    ON_SimpleArray<ON_Curve_*>::Append
              (&(pRightSide->m_segment).super_ON_SimpleArray<ON_Curve_*>,iVar5,ppOVar8);
    iVar5 = ON_SimpleArray<double>::Count((ON_SimpleArray<double> *)&right_t.m_count);
    pdVar6 = ON_SimpleArray<double>::Array((ON_SimpleArray<double> *)&right_t.m_count);
    ON_SimpleArray<double>::Append(&pRightSide->m_t,iVar5,pdVar6);
    iVar5 = ON_SimpleArray<ON_Curve_*>::Count((ON_SimpleArray<ON_Curve_*> *)&left_t.m_count);
    ppOVar8 = ON_SimpleArray<ON_Curve_*>::Array((ON_SimpleArray<ON_Curve_*> *)&left_t.m_count);
    ON_SimpleArray<ON_Curve_*>::Append
              (&(pOStack_58->m_segment).super_ON_SimpleArray<ON_Curve_*>,iVar5,ppOVar8);
    iVar5 = ON_SimpleArray<double>::Count((ON_SimpleArray<double> *)local_108);
    pdVar6 = ON_SimpleArray<double>::Array((ON_SimpleArray<double> *)local_108);
    ON_SimpleArray<double>::Append(&pOStack_58->m_t,iVar5,pdVar6);
    *left_side = &pRightSide->super_ON_Curve;
    *right_side = &pOStack_58->super_ON_Curve;
    this_local._7_1_ = 1;
  }
  local_134 = 1;
  ON_SimpleArray<double>::~ON_SimpleArray((ON_SimpleArray<double> *)local_108);
  ON_SimpleArray<double>::~ON_SimpleArray((ON_SimpleArray<double> *)&right_t.m_count);
  ON_SimpleArray<ON_Curve_*>::~ON_SimpleArray((ON_SimpleArray<ON_Curve_*> *)&left_t.m_count);
  ON_SimpleArray<ON_Curve_*>::~ON_SimpleArray((ON_SimpleArray<ON_Curve_*> *)&right_segment.m_count);
LAB_0080365b:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ON_PolyCurve::Split(
    double split_parameter,
    ON_Curve*& left_side, // left portion returned here
    ON_Curve*& right_side // right portion returned here
  ) const
{
  int si;
  ON_Interval dom = Domain();
  
  ON_PolyCurve* pLeftSide  = ON_PolyCurve::Cast(left_side);
  ON_PolyCurve* pRightSide = ON_PolyCurve::Cast(right_side);

  if ( pLeftSide && pLeftSide != this )
    pLeftSide->Destroy();
  else if ( pLeftSide == this )
    pLeftSide->DestroyCurveTree();

  if ( pRightSide && pRightSide != this )
    pRightSide->Destroy();
  else if ( pRightSide == this )
    pRightSide->DestroyCurveTree();

  if ( left_side && !pLeftSide )
    return false;
  if ( right_side && !pRightSide )
    return false;
  if ( !dom.Includes( split_parameter, true ) )
    return false; // split_parameter is not an interior parameter


  const bool bDupSegs = ( this != pLeftSide && this != pRightSide );

		/* 4 April 2003 Greg Arden		Made the following changes:
																		1.	Use ParameterSearch() to decide if we should snap domain
																				boundaries to m_t array values.
																		2.  Make sure resulting polycurves have Domain() specified as 
																				split parameter.   
																		3.  When true is returned the result passes IsValid().
		*/
	bool split_at_break = ParameterSearch(split_parameter, si, true);
	if( split_at_break && (si<=0 || si>=Count() ) )
		return false;

	ON_Interval s_dom = SegmentDomain(si);
  ON_Curve* seg_curve = SegmentCurve(si);
  if ( !seg_curve )
    return false;
  ON_Interval c_dom = seg_curve->Domain();

  double c;
  if (split_at_break)
    c = c_dom[0];
  else
    c = s_dom.TransformParameterTo(c_dom, split_parameter);

  ON_Curve* seg_left = 0;
  ON_Curve* seg_right = 0;

  if ( !split_at_break  && c_dom.Includes(c,true) )
  {
    if ( !seg_curve->Split( c, seg_left, seg_right ) )
    {
      double fuzz = 0.001; // anything small and > 1.0e-6 will work about the same.
      if ( c_dom.NormalizedParameterAt(c) <= fuzz )
        c = c_dom[0];
      else if ( c_dom.NormalizedParameterAt(c) >= 1.0 - fuzz )
        c = c_dom[1];
      else
        return false; // unable to split this segment
    }
  }
  else if ( c <= c_dom.ParameterAt(0.5) )
    c = c_dom[0];
  else
    c = c_dom[1];

  // use scratch arrays since this may also be pLeftSide or pRightSide
  ON_SimpleArray< ON_Curve* > left_segment;
  ON_SimpleArray< ON_Curve* > right_segment;
  ON_SimpleArray< double > left_t;
  ON_SimpleArray< double > right_t;

  int i;

  if ( seg_left && seg_right )
  {
    // we split a segment
    left_segment.Reserve(si+1);
    right_segment.Reserve(m_segment.Count()-si);
    left_t.Reserve(left_segment.Count()+1);
    right_t.Reserve(right_segment.Count()+1);
    if ( !bDupSegs )
    {
      delete m_segment[si];
      const_cast<ON_PolyCurve*>(this)->m_segment[si] = 0;
    }
    
    for ( i = 0; i < si; i++ )
    {
      if ( bDupSegs )
        left_segment.Append( m_segment[i]->Duplicate() );
      else
        left_segment.Append( m_segment[i] );
      left_t.Append( m_t[i] );
    }
    left_segment.Append( seg_left );
    left_t.Append( m_t[si] );
    left_t.Append( split_parameter );

    right_segment.Append(seg_right);
    right_t.Append( split_parameter );
    for ( i = si+1; i < m_segment.Count(); i++ )
    {
      if ( bDupSegs )
        right_segment.Append( m_segment[i]->Duplicate() );
      else
        right_segment.Append( m_segment[i] );
      right_t.Append( m_t[i] );
    }
    right_t.Append( m_t[m_segment.Count()] );
  }
  else 
  {
    if ( c == c_dom[1] )
      si++;
		if( (c==c_dom[0] && si==0 ) ||								// attempting split at curve start
				(c==c_dom[1] && si==m_segment.Count() ) )	// attempting split at curve end
			return false;

    left_segment.Reserve(si);
    right_segment.Reserve(m_segment.Count()-si);
    left_t.Reserve(left_segment.Count()+1);
    right_t.Reserve(right_segment.Count()+1);
    
    for ( i = 0; i < si; i++ )
    {
      if ( bDupSegs )
        left_segment.Append( m_segment[i]->Duplicate() );
      else
        left_segment.Append( m_segment[i] );
      left_t.Append( m_t[i] );
    }
    left_t.Append( split_parameter );

    for ( i = si; i < m_segment.Count(); i++ )
    {
      if ( bDupSegs )
        right_segment.Append( m_segment[i]->Duplicate() );
      else
        right_segment.Append( m_segment[i] );
      if ( i == si )
        right_t.Append( split_parameter );
      else
        right_t.Append( m_t[i] );
    }
    right_t.Append( m_t[m_segment.Count()] );
  }

  if ( !pLeftSide )
    pLeftSide = new ON_PolyCurve();
  if ( !pRightSide )
    pRightSide = new ON_PolyCurve();
  if ( !bDupSegs )
  {
    // pLeftSide or pRightSide is the same as this
    ON_PolyCurve* this_ptr = const_cast<ON_PolyCurve*>(this);
    this_ptr->m_segment.Zero();
    this_ptr->m_t.Zero();
    this_ptr->m_segment.SetCount(0);
    this_ptr->m_t.SetCount(0);
  }

  pLeftSide->m_segment.Append( left_segment.Count(), left_segment.Array() );
  pLeftSide->m_t.Append( left_t.Count(), left_t.Array() );
  pRightSide->m_segment.Append( right_segment.Count(), right_segment.Array() );
  pRightSide->m_t.Append( right_t.Count(), right_t.Array() );

  left_side = pLeftSide;
  right_side = pRightSide;

  return true;
}